

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int getAndInitPage(BtShared *pBt,Pgno pgno,MemPage **ppPage,BtCursor *pCur,int bReadOnly)

{
  MemPage *pMVar1;
  void *pvVar2;
  char cVar3;
  int iVar4;
  undefined1 uVar5;
  DbPage *pDbPage;
  DbPage *local_30;
  
  if (pBt->nPage < pgno) {
    iVar4 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x112ce,
                "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
    goto LAB_0016472c;
  }
  iVar4 = (*pBt->pPager->xGet)(pBt->pPager,pgno,&local_30,bReadOnly);
  if (iVar4 != 0) goto LAB_0016472c;
  pMVar1 = (MemPage *)local_30->pExtra;
  *ppPage = pMVar1;
  if (pMVar1->isInit == '\0') {
    pvVar2 = local_30->pExtra;
    if (*(Pgno *)((long)pvVar2 + 4) != pgno) {
      *(void **)((long)pvVar2 + 0x50) = local_30->pData;
      *(DbPage **)((long)pvVar2 + 0x70) = local_30;
      *(BtShared **)((long)pvVar2 + 0x48) = pBt;
      *(Pgno *)((long)pvVar2 + 4) = pgno;
      uVar5 = 100;
      if (pgno != 1) {
        uVar5 = 0;
      }
      *(undefined1 *)((long)pvVar2 + 9) = uVar5;
    }
    iVar4 = btreeInitPage(*ppPage);
    if (iVar4 == 0) goto LAB_0016476c;
  }
  else {
LAB_0016476c:
    if (pCur == (BtCursor *)0x0) {
      return 0;
    }
    if (((*ppPage)->nCell != 0) && ((*ppPage)->intKey == pCur->curIntKey)) {
      return 0;
    }
    iVar4 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x112e3,
                "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
  }
  if (*ppPage != (MemPage *)0x0) {
    sqlite3PagerUnrefNotNull((*ppPage)->pDbPage);
  }
LAB_0016472c:
  if (pCur != (BtCursor *)0x0) {
    cVar3 = pCur->iPage + -1;
    pCur->iPage = cVar3;
    pCur->pPage = pCur->apPage[cVar3];
  }
  return iVar4;
}

Assistant:

static int getAndInitPage(
  BtShared *pBt,                  /* The database file */
  Pgno pgno,                      /* Number of the page to get */
  MemPage **ppPage,               /* Write the page pointer here */
  BtCursor *pCur,                 /* Cursor to receive the page, or NULL */
  int bReadOnly                   /* True for a read-only page */
){
  int rc;
  DbPage *pDbPage;
  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( pCur==0 || ppPage==&pCur->pPage );
  assert( pCur==0 || bReadOnly==pCur->curPagerFlags );
  assert( pCur==0 || pCur->iPage>0 );

  if( pgno>btreePagecount(pBt) ){
    rc = SQLITE_CORRUPT_BKPT;
    goto getAndInitPage_error1;
  }
  rc = sqlite3PagerGet(pBt->pPager, pgno, (DbPage**)&pDbPage, bReadOnly);
  if( rc ){
    goto getAndInitPage_error1;
  }
  *ppPage = (MemPage*)sqlite3PagerGetExtra(pDbPage);
  if( (*ppPage)->isInit==0 ){
    btreePageFromDbPage(pDbPage, pgno, pBt);
    rc = btreeInitPage(*ppPage);
    if( rc!=SQLITE_OK ){
      goto getAndInitPage_error2;
    }
  }
  assert( (*ppPage)->pgno==pgno || CORRUPT_DB );
  assert( (*ppPage)->aData==sqlite3PagerGetData(pDbPage) );

  /* If obtaining a child page for a cursor, we must verify that the page is
  ** compatible with the root page. */
  if( pCur && ((*ppPage)->nCell<1 || (*ppPage)->intKey!=pCur->curIntKey) ){
    rc = SQLITE_CORRUPT_PGNO(pgno);
    goto getAndInitPage_error2;
  }
  return SQLITE_OK;

getAndInitPage_error2:
  releasePage(*ppPage);
getAndInitPage_error1:
  if( pCur ){
    pCur->iPage--;
    pCur->pPage = pCur->apPage[pCur->iPage];
  }
  testcase( pgno==0 );
  assert( pgno!=0 || rc!=SQLITE_OK );
  return rc;
}